

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PDU_Factory.cpp
# Opt level: O0

unique_ptr<KDIS::PDU::Header7,_std::default_delete<KDIS::PDU::Header7>_> __thiscall
KDIS::UTILS::PDU_Factory::applyFilters(PDU_Factory *this,Header *H)

{
  bool bVar1;
  reference ppPVar2;
  ulong uVar3;
  PDU_Factory_Filter **in_RDX;
  __normal_iterator<KDIS::UTILS::PDU_Factory_Filter_**,_std::vector<KDIS::UTILS::PDU_Factory_Filter_*,_std::allocator<KDIS::UTILS::PDU_Factory_Filter_*>_>_>
  local_40;
  __normal_iterator<KDIS::UTILS::PDU_Factory_Filter_*const_*,_std::vector<KDIS::UTILS::PDU_Factory_Filter_*,_std::allocator<KDIS::UTILS::PDU_Factory_Filter_*>_>_>
  local_38;
  const_iterator citrEnd;
  __normal_iterator<KDIS::UTILS::PDU_Factory_Filter_*const_*,_std::vector<KDIS::UTILS::PDU_Factory_Filter_*,_std::allocator<KDIS::UTILS::PDU_Factory_Filter_*>_>_>
  local_28;
  const_iterator citr;
  Header *H_local;
  PDU_Factory *this_local;
  
  citr._M_current = in_RDX;
  citrEnd._M_current =
       (PDU_Factory_Filter **)
       std::
       vector<KDIS::UTILS::PDU_Factory_Filter_*,_std::allocator<KDIS::UTILS::PDU_Factory_Filter_*>_>
       ::begin((vector<KDIS::UTILS::PDU_Factory_Filter_*,_std::allocator<KDIS::UTILS::PDU_Factory_Filter_*>_>
                *)&(H->super_Header6).m_ui8ProtocolVersion);
  __gnu_cxx::
  __normal_iterator<KDIS::UTILS::PDU_Factory_Filter*const*,std::vector<KDIS::UTILS::PDU_Factory_Filter*,std::allocator<KDIS::UTILS::PDU_Factory_Filter*>>>
  ::__normal_iterator<KDIS::UTILS::PDU_Factory_Filter**>
            ((__normal_iterator<KDIS::UTILS::PDU_Factory_Filter*const*,std::vector<KDIS::UTILS::PDU_Factory_Filter*,std::allocator<KDIS::UTILS::PDU_Factory_Filter*>>>
              *)&local_28,
             (__normal_iterator<KDIS::UTILS::PDU_Factory_Filter_**,_std::vector<KDIS::UTILS::PDU_Factory_Filter_*,_std::allocator<KDIS::UTILS::PDU_Factory_Filter_*>_>_>
              *)&citrEnd);
  local_40._M_current =
       (PDU_Factory_Filter **)
       std::
       vector<KDIS::UTILS::PDU_Factory_Filter_*,_std::allocator<KDIS::UTILS::PDU_Factory_Filter_*>_>
       ::end((vector<KDIS::UTILS::PDU_Factory_Filter_*,_std::allocator<KDIS::UTILS::PDU_Factory_Filter_*>_>
              *)&(H->super_Header6).m_ui8ProtocolVersion);
  __gnu_cxx::
  __normal_iterator<KDIS::UTILS::PDU_Factory_Filter*const*,std::vector<KDIS::UTILS::PDU_Factory_Filter*,std::allocator<KDIS::UTILS::PDU_Factory_Filter*>>>
  ::__normal_iterator<KDIS::UTILS::PDU_Factory_Filter**>
            ((__normal_iterator<KDIS::UTILS::PDU_Factory_Filter*const*,std::vector<KDIS::UTILS::PDU_Factory_Filter*,std::allocator<KDIS::UTILS::PDU_Factory_Filter*>>>
              *)&local_38,&local_40);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=(&local_28,&local_38);
    if (!bVar1) {
      std::unique_ptr<KDIS::PDU::Header7,std::default_delete<KDIS::PDU::Header7>>::
      unique_ptr<std::default_delete<KDIS::PDU::Header7>,void>
                ((unique_ptr<KDIS::PDU::Header7,std::default_delete<KDIS::PDU::Header7>> *)this,
                 (pointer)citr._M_current);
      return (__uniq_ptr_data<KDIS::PDU::Header7,_std::default_delete<KDIS::PDU::Header7>,_true,_true>
              )(__uniq_ptr_data<KDIS::PDU::Header7,_std::default_delete<KDIS::PDU::Header7>,_true,_true>
                )this;
    }
    ppPVar2 = __gnu_cxx::
              __normal_iterator<KDIS::UTILS::PDU_Factory_Filter_*const_*,_std::vector<KDIS::UTILS::PDU_Factory_Filter_*,_std::allocator<KDIS::UTILS::PDU_Factory_Filter_*>_>_>
              ::operator*(&local_28);
    uVar3 = (**(code **)(*(long *)*ppPVar2 + 0x18))(*ppPVar2,citr._M_current);
    if ((uVar3 & 1) == 0) break;
    __gnu_cxx::
    __normal_iterator<KDIS::UTILS::PDU_Factory_Filter_*const_*,_std::vector<KDIS::UTILS::PDU_Factory_Filter_*,_std::allocator<KDIS::UTILS::PDU_Factory_Filter_*>_>_>
    ::operator++(&local_28);
  }
  if (citr._M_current != (PDU_Factory_Filter **)0x0) {
    (**(code **)(*citr._M_current + 8))();
  }
  std::unique_ptr<KDIS::PDU::Header7,std::default_delete<KDIS::PDU::Header7>>::
  unique_ptr<std::default_delete<KDIS::PDU::Header7>,void>
            ((unique_ptr<KDIS::PDU::Header7,std::default_delete<KDIS::PDU::Header7>> *)this);
  return (__uniq_ptr_data<KDIS::PDU::Header7,_std::default_delete<KDIS::PDU::Header7>,_true,_true>)
         (__uniq_ptr_data<KDIS::PDU::Header7,_std::default_delete<KDIS::PDU::Header7>,_true,_true>)
         this;
}

Assistant:

unique_ptr<Header> PDU_Factory::applyFilters( Header * H )
{
    // Test all the filters
    vector<PDU_Factory_Filter*>::const_iterator citr = m_vFilters.begin();
    vector<PDU_Factory_Filter*>::const_iterator citrEnd = m_vFilters.end();

    for( ; citr != citrEnd; ++citr )
    {
        if( !( *citr )->ApplyFilter( H ) )
        {
            // The PDU failed a test so free the memory and return NULL.
            delete H;
            return unique_ptr<Header>();
        }
    }

    return unique_ptr<Header>( H );
}